

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O3

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,int dst_x,int dst_y,
          image<crnlib::color_quad<unsigned_char,_int>_> *src)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint src_y;
  uint uVar5;
  uint src_h;
  uint src_x;
  
  if ((this->m_total != 0) && (src->m_total != 0)) {
    src_y = 0;
    if (dst_x < 0) {
      src_x = -dst_x;
      uVar4 = src->m_width;
      iVar1 = uVar4 + dst_x;
      dst_x = 0;
      if (uVar4 == src_x || SBORROW4(uVar4,src_x) != iVar1 < 0) {
        return false;
      }
    }
    else {
      src_x = 0;
    }
    if (dst_y < 0) {
      src_y = -dst_y;
      uVar4 = src->m_height;
      iVar1 = uVar4 + dst_y;
      dst_y = 0;
      if (uVar4 == src_y || SBORROW4(uVar4,src_y) != iVar1 < 0) {
        return false;
      }
    }
    uVar3 = this->m_width - dst_x;
    if (uVar3 != 0 && dst_x <= (int)this->m_width) {
      uVar5 = this->m_height - dst_y;
      if (uVar5 == 0 || (int)this->m_height < dst_y) {
        bVar2 = false;
      }
      else {
        uVar4 = src->m_width - src_x;
        if (uVar3 < uVar4) {
          uVar4 = uVar3;
        }
        src_h = src->m_height - src_y;
        if (uVar5 < src_h) {
          src_h = uVar5;
        }
        unclipped_blit(this,src_x,src_y,uVar4,src_h,dst_x,dst_y,src);
        bVar2 = true;
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool blit(int dst_x, int dst_y, const image& src)
        {
            if ((!is_valid()) || (!src.is_valid()))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            int src_x = 0;
            int src_y = 0;

            if (dst_x < 0)
            {
                src_x = -dst_x;
                if (src_x >= static_cast<int>(src.get_width()))
                {
                    return false;
                }
                dst_x = 0;
            }

            if (dst_y < 0)
            {
                src_y = -dst_y;
                if (src_y >= static_cast<int>(src.get_height()))
                {
                    return false;
                }
                dst_y = 0;
            }

            if ((dst_x >= (int)m_width) || (dst_y >= (int)m_height))
            {
                return false;
            }

            uint width = math::minimum(m_width - dst_x, src.get_width() - src_x);
            uint height = math::minimum(m_height - dst_y, src.get_height() - src_y);

            bool success = unclipped_blit(src_x, src_y, width, height, dst_x, dst_y, src);
            (void)success;
            CRNLIB_ASSERT(success);

            return true;
        }